

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O3

void __thiscall
EnvironmentNAVXYTHETALATTICE::DeprecatedPrecomputeActions(EnvironmentNAVXYTHETALATTICE *this)

{
  vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *__s;
  undefined8 *puVar1;
  long lVar2;
  pointer psVar3;
  pointer psVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double __x;
  double dVar7;
  double dVar8;
  sbpl_xy_theta_pt_t pose;
  sbpl_xy_theta_pt_t pose_00;
  sbpl_xy_theta_pt_t pose_01;
  char cVar9;
  ulong uVar10;
  EnvNAVXYTHETALATAction_t **ppEVar11;
  ulong *puVar12;
  EnvNAVXYTHETALATAction_t *pEVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  char cVar19;
  ulong uVar20;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  double dVar21;
  double dVar22;
  EnvNAVXYTHETALATAction_t *local_148;
  pointer *local_140;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *local_138;
  undefined8 local_130;
  double local_128;
  long local_120;
  EnvironmentNAVXYTHETALATTICE *local_118;
  ulong local_110;
  double local_108;
  double dStack_100;
  undefined8 local_f8;
  double local_f0;
  double dStack_e8;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> local_d8;
  double local_c0;
  double dStack_b8;
  undefined8 local_b0;
  double local_a8;
  double dStack_a0;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> local_90;
  double local_78;
  double dStack_70;
  undefined8 local_68;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> local_60;
  double local_48;
  double dStack_40;
  
  iVar15 = (this->EnvNAVXYTHETALATCfg).NumThetaDirs;
  uVar20 = (ulong)iVar15;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar20;
  uVar10 = SUB168(auVar5 * ZEXT816(0x18),0);
  uVar18 = uVar10 + 8;
  if (0xfffffffffffffff7 < uVar10) {
    uVar18 = 0xffffffffffffffff;
  }
  if (SUB168(auVar5 * ZEXT816(0x18),8) != 0) {
    uVar18 = 0xffffffffffffffff;
  }
  uVar17 = uVar20 * 8;
  if (iVar15 < 0) {
    uVar17 = 0xffffffffffffffff;
  }
  ppEVar11 = (EnvNAVXYTHETALATAction_t **)operator_new__(uVar17);
  (this->EnvNAVXYTHETALATCfg).ActionsV = ppEVar11;
  puVar12 = (ulong *)operator_new__(uVar18);
  __s = (vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *)
        (puVar12 + 1);
  *puVar12 = uVar20;
  if (iVar15 == 0) {
    (this->EnvNAVXYTHETALATCfg).PredActionsV = __s;
  }
  else {
    memset(__s,0,((uVar10 - 0x18) / 0x18) * 0x18 + 0x18);
    (this->EnvNAVXYTHETALATCfg).PredActionsV = __s;
    if (0 < iVar15) {
      local_138 = &(this->EnvNAVXYTHETALATCfg).FootprintPolygon;
      local_140 = &local_60.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      uVar10 = 0;
      local_120 = -1;
      local_118 = this;
      do {
        uVar17 = (ulong)(this->EnvNAVXYTHETALATCfg).actionwidth;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar17;
        uVar18 = SUB168(auVar6 * ZEXT816(0x68),0);
        uVar20 = uVar18 + 8;
        if (0xfffffffffffffff7 < uVar18) {
          uVar20 = 0xffffffffffffffff;
        }
        if (SUB168(auVar6 * ZEXT816(0x68),8) != 0) {
          uVar20 = 0xffffffffffffffff;
        }
        puVar12 = (ulong *)operator_new__(uVar20);
        *puVar12 = uVar17;
        if (uVar17 != 0) {
          lVar16 = 0;
          do {
            puVar1 = (undefined8 *)((long)puVar12 + lVar16 + 0x48);
            *puVar1 = 0;
            puVar1[1] = 0;
            puVar1 = (undefined8 *)((long)puVar12 + lVar16 + 0x38);
            *puVar1 = 0;
            puVar1[1] = 0;
            puVar1 = (undefined8 *)((long)puVar12 + lVar16 + 0x28);
            *puVar1 = 0;
            puVar1[1] = 0;
            puVar1 = (undefined8 *)((long)puVar12 + lVar16 + 0x18);
            *puVar1 = 0;
            puVar1[1] = 0;
            *(undefined8 *)((long)puVar12 + lVar16 + 0x58) = 0;
            lVar16 = lVar16 + 0x68;
          } while (uVar17 * 0x68 - lVar16 != 0);
        }
        (this->EnvNAVXYTHETALATCfg).ActionsV[uVar10] = (EnvNAVXYTHETALATAction_t *)(puVar12 + 1);
        dVar22 = (this->EnvNAVXYTHETALATCfg).cellsize_m;
        local_128 = dVar22 * 0.0 + dVar22 * 0.5;
        (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x20])
                  (this,uVar10 & 0xffffffff);
        local_130 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        lVar16 = 0;
        iVar15 = 0;
        uVar18 = uVar10;
        local_110 = uVar10;
        do {
          pEVar13 = (this->EnvNAVXYTHETALATCfg).ActionsV[uVar18];
          (&pEVar13->aind)[lVar16] = (uchar)iVar15;
          (&pEVar13->starttheta)[lVar16] = (char)uVar18;
          cVar9 = (char)(((int)local_120 + iVar15) % (this->EnvNAVXYTHETALATCfg).NumThetaDirs);
          (&pEVar13->endtheta)[lVar16] = cVar9;
          (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x20])
                    (this,(ulong)(uint)(int)cVar9);
          __x = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
          dVar22 = cos((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
          dVar7 = cos(__x);
          (&(this->EnvNAVXYTHETALATCfg).ActionsV[uVar18]->dX)[lVar16] =
               (char)(int)(dVar22 + *(double *)(&DAT_001476f0 + (ulong)(0.0 < dVar7) * 8));
          dVar8 = sin(__x);
          dVar22 = sin(__x);
          dVar22 = *(double *)(&DAT_001476f0 + (ulong)(0.0 < dVar22) * 8);
          ppEVar11 = (this->EnvNAVXYTHETALATCfg).ActionsV;
          pEVar13 = ppEVar11[uVar18];
          cVar19 = (char)(int)(dVar8 + dVar22);
          (&pEVar13->dY)[lVar16] = cVar19;
          dVar7 = (this->EnvNAVXYTHETALATCfg).cellsize_m;
          cVar9 = (&pEVar13->dX)[lVar16];
          dVar21 = ceil(SQRT((double)((int)cVar19 * (int)cVar19 + (int)cVar9 * (int)cVar9)) *
                        ((dVar7 * 1000.0) / (this->EnvNAVXYTHETALATCfg).nominalvel_mpersecs));
          *(int *)((long)&pEVar13->cost + lVar16) = (int)dVar21;
          lVar2 = *(long *)((long)&(pEVar13->intermptV).
                                   super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar16);
          if (*(long *)((long)&(pEVar13->intermptV).
                               super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish + lVar16) != lVar2) {
            *(long *)((long)&(pEVar13->intermptV).
                             super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish + lVar16) = lVar2;
            pEVar13 = ppEVar11[uVar18];
          }
          lVar2 = *(long *)((long)&(pEVar13->intersectingcellsV).
                                   super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar16);
          if (*(long *)((long)&(pEVar13->intersectingcellsV).
                               super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                               _M_impl.super__Vector_impl_data._M_finish + lVar16) != lVar2) {
            *(long *)((long)&(pEVar13->intersectingcellsV).
                             super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                             _M_impl.super__Vector_impl_data._M_finish + lVar16) = lVar2;
          }
          dVar21 = dVar7 * 0.5 + dVar7 * (double)(int)cVar9;
          dVar22 = dVar7 * 0.5 +
                   dVar7 * (double)(int)((long)((ulong)(ushort)((int)(dVar8 + dVar22) << 8) << 0x30)
                                        >> 0x38);
          std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::vector(&local_60,local_138);
          uVar18 = local_110;
          this = local_118;
          pose.y._0_4_ = SUB84(dVar22,0);
          pose.x = dVar21;
          pose.y._4_4_ = (int)((ulong)dVar22 >> 0x20);
          pose.theta = __x;
          local_48 = dVar21;
          dStack_40 = dVar22;
          get_2d_footprint_cells
                    (&local_60,
                     (vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)
                     ((long)&((local_118->EnvNAVXYTHETALATCfg).ActionsV[local_110]->
                             intersectingcellsV).
                             super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar16),pose,
                     (local_118->EnvNAVXYTHETALATCfg).cellsize_m);
          if (local_60.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_60.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_60.
                                  super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_60.
                                  super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          local_78 = local_128;
          dStack_70 = local_128;
          local_68 = local_130;
          (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x44])
                    (this,(long)&((this->EnvNAVXYTHETALATCfg).ActionsV[uVar18]->intersectingcellsV).
                                 super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar16);
          pEVar13 = (this->EnvNAVXYTHETALATCfg).ActionsV[uVar18];
          iVar14 = (int)(&pEVar13->endtheta)[lVar16];
          local_148 = (EnvNAVXYTHETALATAction_t *)(&pEVar13->aind + lVar16);
          std::vector<EnvNAVXYTHETALATAction_t*,std::allocator<EnvNAVXYTHETALATAction_t*>>::
          emplace_back<EnvNAVXYTHETALATAction_t*>
                    ((vector<EnvNAVXYTHETALATAction_t*,std::allocator<EnvNAVXYTHETALATAction_t*>> *)
                     ((this->EnvNAVXYTHETALATCfg).PredActionsV +
                     ((iVar14 >> 0x1f & (this->EnvNAVXYTHETALATCfg).NumThetaDirs) + iVar14)),
                     &local_148);
          iVar15 = iVar15 + 1;
          lVar16 = lVar16 + 0x68;
        } while (lVar16 != 0x138);
        pEVar13 = (this->EnvNAVXYTHETALATCfg).ActionsV[uVar18];
        pEVar13[3].aind = '\x03';
        cVar19 = (char)uVar18;
        pEVar13[3].starttheta = cVar19;
        cVar9 = cVar19 + -1;
        pEVar13[3].endtheta = cVar9;
        if (cVar9 < '\0') {
          cVar9 = cVar9 + (char)(this->EnvNAVXYTHETALATCfg).NumThetaDirs;
          pEVar13[3].endtheta = cVar9;
        }
        pEVar13[3].dX = '\0';
        pEVar13[3].dY = '\0';
        pEVar13[3].cost = (int)((this->EnvNAVXYTHETALATCfg).timetoturn45degsinplace_secs * 1000.0);
        dVar22 = (this->EnvNAVXYTHETALATCfg).cellsize_m;
        (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x20])
                  (this,(ulong)(uint)(int)cVar9);
        pose_00.theta._4_4_ = extraout_XMM0_Db_01;
        pose_00.theta._0_4_ = extraout_XMM0_Da_01;
        ppEVar11 = (this->EnvNAVXYTHETALATCfg).ActionsV;
        pEVar13 = ppEVar11[uVar18];
        psVar3 = pEVar13[3].intermptV.
                 super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl
                 .super__Vector_impl_data._M_start;
        if (pEVar13[3].intermptV.
            super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl.
            super__Vector_impl_data._M_finish != psVar3) {
          pEVar13[3].intermptV.
          super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl.
          super__Vector_impl_data._M_finish = psVar3;
          pEVar13 = ppEVar11[uVar18];
        }
        psVar4 = pEVar13[3].intersectingcellsV.
                 super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (pEVar13[3].intersectingcellsV.
            super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
            super__Vector_impl_data._M_finish != psVar4) {
          pEVar13[3].intersectingcellsV.
          super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
          super__Vector_impl_data._M_finish = psVar4;
        }
        dVar22 = dVar22 * 0.0 + dVar22 * 0.5;
        std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::vector(&local_90,local_138);
        pose_00.y._0_4_ = SUB84(dVar22,0);
        pose_00.x = dVar22;
        pose_00.y._4_4_ = (int)((ulong)dVar22 >> 0x20);
        local_a8 = dVar22;
        dStack_a0 = dVar22;
        get_2d_footprint_cells
                  (&local_90,&(this->EnvNAVXYTHETALATCfg).ActionsV[uVar18][3].intersectingcellsV,
                   pose_00,(this->EnvNAVXYTHETALATCfg).cellsize_m);
        if (local_90.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_90.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_90.
                                super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_90.
                                super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_c0 = local_128;
        dStack_b8 = local_128;
        local_b0 = local_130;
        (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x44])
                  (this,&(this->EnvNAVXYTHETALATCfg).ActionsV[uVar18][3].intersectingcellsV);
        local_148 = (this->EnvNAVXYTHETALATCfg).ActionsV[uVar18];
        iVar15 = (int)local_148[3].endtheta;
        local_148 = local_148 + 3;
        std::vector<EnvNAVXYTHETALATAction_t*,std::allocator<EnvNAVXYTHETALATAction_t*>>::
        emplace_back<EnvNAVXYTHETALATAction_t*>
                  ((vector<EnvNAVXYTHETALATAction_t*,std::allocator<EnvNAVXYTHETALATAction_t*>> *)
                   ((this->EnvNAVXYTHETALATCfg).PredActionsV +
                   ((iVar15 >> 0x1f & (this->EnvNAVXYTHETALATCfg).NumThetaDirs) + iVar15)),
                   &local_148);
        pEVar13 = (this->EnvNAVXYTHETALATCfg).ActionsV[uVar18];
        pEVar13[4].aind = '\x04';
        pEVar13[4].starttheta = cVar19;
        uVar10 = uVar18 + 1;
        cVar9 = (char)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) %
                      (long)(this->EnvNAVXYTHETALATCfg).NumThetaDirs);
        pEVar13[4].endtheta = cVar9;
        pEVar13[4].dX = '\0';
        pEVar13[4].dY = '\0';
        pEVar13[4].cost = (int)((this->EnvNAVXYTHETALATCfg).timetoturn45degsinplace_secs * 1000.0);
        dVar22 = (this->EnvNAVXYTHETALATCfg).cellsize_m;
        (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x20])
                  (this,(ulong)(uint)(int)cVar9);
        pose_01.theta._4_4_ = extraout_XMM0_Db_02;
        pose_01.theta._0_4_ = extraout_XMM0_Da_02;
        ppEVar11 = (this->EnvNAVXYTHETALATCfg).ActionsV;
        pEVar13 = ppEVar11[uVar18];
        psVar3 = pEVar13[4].intermptV.
                 super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl
                 .super__Vector_impl_data._M_start;
        if (pEVar13[4].intermptV.
            super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl.
            super__Vector_impl_data._M_finish != psVar3) {
          pEVar13[4].intermptV.
          super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl.
          super__Vector_impl_data._M_finish = psVar3;
          pEVar13 = ppEVar11[uVar18];
        }
        psVar4 = pEVar13[4].intersectingcellsV.
                 super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (pEVar13[4].intersectingcellsV.
            super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
            super__Vector_impl_data._M_finish != psVar4) {
          pEVar13[4].intersectingcellsV.
          super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
          super__Vector_impl_data._M_finish = psVar4;
        }
        dVar22 = dVar22 * 0.0 + dVar22 * 0.5;
        std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::vector(&local_d8,local_138);
        pose_01.y._0_4_ = SUB84(dVar22,0);
        pose_01.x = dVar22;
        pose_01.y._4_4_ = (int)((ulong)dVar22 >> 0x20);
        local_f0 = dVar22;
        dStack_e8 = dVar22;
        get_2d_footprint_cells
                  (&local_d8,&(this->EnvNAVXYTHETALATCfg).ActionsV[uVar18][4].intersectingcellsV,
                   pose_01,(this->EnvNAVXYTHETALATCfg).cellsize_m);
        if (local_d8.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_d8.
                                super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.
                                super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_108 = local_128;
        dStack_100 = local_128;
        local_f8 = local_130;
        (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x44])
                  (this,&(this->EnvNAVXYTHETALATCfg).ActionsV[uVar18][4].intersectingcellsV);
        local_148 = (this->EnvNAVXYTHETALATCfg).ActionsV[uVar18];
        iVar15 = (int)local_148[4].endtheta;
        local_148 = local_148 + 4;
        std::vector<EnvNAVXYTHETALATAction_t*,std::allocator<EnvNAVXYTHETALATAction_t*>>::
        emplace_back<EnvNAVXYTHETALATAction_t*>
                  ((vector<EnvNAVXYTHETALATAction_t*,std::allocator<EnvNAVXYTHETALATAction_t*>> *)
                   ((this->EnvNAVXYTHETALATCfg).PredActionsV +
                   ((iVar15 >> 0x1f & (this->EnvNAVXYTHETALATCfg).NumThetaDirs) + iVar15)),
                   &local_148);
        local_120 = local_120 + 1;
      } while ((long)uVar10 < (long)(this->EnvNAVXYTHETALATCfg).NumThetaDirs);
    }
  }
  (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x4b])(this);
  return;
}

Assistant:

void EnvironmentNAVXYTHETALATTICE::DeprecatedPrecomputeActions()
{
    SBPL_PRINTF("Use of DeprecatedPrecomputeActions() is deprecated and probably doesn't work!\n");

    // construct list of actions
    SBPL_PRINTF("Pre-computing action data using the motion primitives for a 3D kinematic planning...\n");
    EnvNAVXYTHETALATCfg.ActionsV = new EnvNAVXYTHETALATAction_t*[EnvNAVXYTHETALATCfg.NumThetaDirs];
    EnvNAVXYTHETALATCfg.PredActionsV = new std::vector<EnvNAVXYTHETALATAction_t*> [EnvNAVXYTHETALATCfg.NumThetaDirs];
    std::vector<sbpl_2Dcell_t> footprint;
    // iterate over source angles
    for (int tind = 0; tind < EnvNAVXYTHETALATCfg.NumThetaDirs; tind++) {
        SBPL_PRINTF("processing angle %d\n", tind);
        EnvNAVXYTHETALATCfg.ActionsV[tind] = new EnvNAVXYTHETALATAction_t[EnvNAVXYTHETALATCfg.actionwidth];

        // compute sourcepose
        sbpl_xy_theta_pt_t sourcepose;
        sourcepose.x = DISCXY2CONT(0, EnvNAVXYTHETALATCfg.cellsize_m);
        sourcepose.y = DISCXY2CONT(0, EnvNAVXYTHETALATCfg.cellsize_m);
        sourcepose.theta = DiscTheta2ContNew(tind);

        // the construction assumes that the robot first turns and then goes
        // along this new theta
        int aind = 0;
        for (; aind < 3; aind++) {
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].aind = aind;
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].starttheta = tind;
            // -1,0,1
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta = (tind + aind - 1) % EnvNAVXYTHETALATCfg.NumThetaDirs;
            double angle = DiscTheta2ContNew(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta);
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX = (int)(cos(angle) + 0.5 * (cos(angle) > 0 ? 1 : -1));
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY = (int)(sin(angle) + 0.5 * (sin(angle) > 0 ? 1 : -1));
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost = (int)(ceil(NAVXYTHETALAT_COSTMULT_MTOMM *
                    EnvNAVXYTHETALATCfg.cellsize_m / EnvNAVXYTHETALATCfg.nominalvel_mpersecs *
                    sqrt((double)(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX *
                            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX + EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY *
                            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY))));

            // compute intersecting cells
            sbpl_xy_theta_pt_t pose;
            pose.x = DISCXY2CONT(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX, EnvNAVXYTHETALATCfg.cellsize_m);
            pose.y = DISCXY2CONT(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY, EnvNAVXYTHETALATCfg.cellsize_m);
            pose.theta = angle;
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV.clear();
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV.clear();
            get_2d_footprint_cells(
                    EnvNAVXYTHETALATCfg.FootprintPolygon,
                    &EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV,
                    pose,
                    EnvNAVXYTHETALATCfg.cellsize_m);
            RemoveSourceFootprint(sourcepose, &EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV);

#if DEBUG
            SBPL_PRINTF("action tind=%d aind=%d: endtheta=%d (%f) dX=%d dY=%d cost=%d\n",
                        tind, aind, EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta, angle,
                        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX, EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY,
                        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost);
#endif

            // add to the list of backward actions
            int targettheta = EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta;
            if (targettheta < 0) {
                targettheta = targettheta + EnvNAVXYTHETALATCfg.NumThetaDirs;
            }
            EnvNAVXYTHETALATCfg.PredActionsV[targettheta].push_back(&(EnvNAVXYTHETALATCfg.ActionsV[tind][aind]));
        }

        // decrease and increase angle without movement
        aind = 3;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].aind = aind;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].starttheta = tind;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta = tind - 1;
        if (EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta < 0) {
            EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta += EnvNAVXYTHETALATCfg.NumThetaDirs;
        }
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX = 0;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY = 0;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost =
                (int)(NAVXYTHETALAT_COSTMULT_MTOMM * EnvNAVXYTHETALATCfg.timetoturn45degsinplace_secs);

        // compute intersecting cells
        sbpl_xy_theta_pt_t pose;
        pose.x = DISCXY2CONT(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX, EnvNAVXYTHETALATCfg.cellsize_m);
        pose.y = DISCXY2CONT(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY, EnvNAVXYTHETALATCfg.cellsize_m);
        pose.theta = DiscTheta2ContNew(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta);
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV.clear();
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV.clear();
        get_2d_footprint_cells(
                EnvNAVXYTHETALATCfg.FootprintPolygon,
                &EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV,
                pose,
                EnvNAVXYTHETALATCfg.cellsize_m);
        RemoveSourceFootprint(sourcepose, &EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV);

#if DEBUG
        SBPL_PRINTF("action tind=%d aind=%d: endtheta=%d (%f) dX=%d dY=%d cost=%d\n",
                    tind, aind, EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta,
                    DiscTheta2ContNew(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta),
                    EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX, EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY,
                    EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost);
#endif

        // add to the list of backward actions
        int targettheta = EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta;
        if (targettheta < 0) {
            targettheta = targettheta + EnvNAVXYTHETALATCfg.NumThetaDirs;
        }
        EnvNAVXYTHETALATCfg.PredActionsV[targettheta].push_back(&(EnvNAVXYTHETALATCfg.ActionsV[tind][aind]));

        aind = 4;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].aind = aind;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].starttheta = tind;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta = (tind + 1) % EnvNAVXYTHETALATCfg.NumThetaDirs;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX = 0;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY = 0;
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost =
                (int)(NAVXYTHETALAT_COSTMULT_MTOMM * EnvNAVXYTHETALATCfg.timetoturn45degsinplace_secs);

        // compute intersecting cells
        pose.x = DISCXY2CONT(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX, EnvNAVXYTHETALATCfg.cellsize_m);
        pose.y = DISCXY2CONT(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY, EnvNAVXYTHETALATCfg.cellsize_m);
        pose.theta = DiscTheta2ContNew(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta);
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intermptV.clear();
        EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV.clear();
        get_2d_footprint_cells(
                EnvNAVXYTHETALATCfg.FootprintPolygon,
                &EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV,
                pose,
                EnvNAVXYTHETALATCfg.cellsize_m);
        RemoveSourceFootprint(sourcepose, &EnvNAVXYTHETALATCfg.ActionsV[tind][aind].intersectingcellsV);

#if DEBUG
        SBPL_PRINTF("action tind=%d aind=%d: endtheta=%d (%f) dX=%d dY=%d cost=%d\n",
                    tind, aind, EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta, DiscTheta2ContNew(EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta),
                    EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dX, EnvNAVXYTHETALATCfg.ActionsV[tind][aind].dY,
                    EnvNAVXYTHETALATCfg.ActionsV[tind][aind].cost);
#endif

        // add to the list of backward actions
        targettheta = EnvNAVXYTHETALATCfg.ActionsV[tind][aind].endtheta;
        if (targettheta < 0) targettheta = targettheta + EnvNAVXYTHETALATCfg.NumThetaDirs;
        EnvNAVXYTHETALATCfg.PredActionsV[targettheta].push_back(&(EnvNAVXYTHETALATCfg.ActionsV[tind][aind]));
    }

    // now compute replanning data
    ComputeReplanningData();

    SBPL_PRINTF("done pre-computing action data\n");
}